

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

void slab_put_with_order(slab_cache *cache,slab *slab)

{
  small_stats *psVar1;
  size_t *psVar2;
  byte bVar3;
  rlist *prVar4;
  rlist *prVar5;
  ulong uVar6;
  slab_arena *arena;
  uint8_t order;
  slab *psVar7;
  slab *psVar8;
  size_t sVar9;
  byte bVar10;
  
  slab_assert(cache,slab);
  bVar10 = slab->order;
  if (cache->order_max < bVar10) {
    __assert_fail("slab->order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x14e,"void slab_put_with_order(struct slab_cache *, struct slab *)");
  }
  if (bVar10 + 1 != (uint)slab->in_use) {
    __assert_fail("slab->in_use == slab->order + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x53,"void slab_set_free(struct slab_cache *, struct slab *)");
  }
  sVar9 = slab->size;
  psVar1 = &(cache->allocated).stats;
  psVar1->used = psVar1->used - sVar9;
  psVar1 = &cache->orders[bVar10].stats;
  psVar1->used = psVar1->used - sVar9;
  slab->in_use = '\0';
  psVar7 = slab_buddy(cache,slab);
  if (psVar7 == (slab *)0x0) {
    bVar10 = slab->order;
  }
  else {
    bVar3 = psVar7->order;
    bVar10 = slab->order;
    if ((bVar3 == bVar10) && (bVar10 = bVar3, psVar7->in_use == '\0')) {
      psVar2 = &cache->orders[bVar3].stats.total;
      *psVar2 = *psVar2 - slab->size;
      do {
        psVar8 = slab_buddy(cache,slab);
        if (psVar8 != psVar7) {
          __assert_fail("slab_buddy(cache, slab) == buddy",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                        ,0x9f,
                        "struct slab *slab_merge(struct slab_cache *, struct slab *, struct slab *)"
                       );
        }
        if (psVar7 < slab) {
          slab = psVar7;
        }
        prVar4 = (psVar7->next_in_list).prev;
        prVar5 = (psVar7->next_in_list).next;
        prVar4->next = prVar5;
        prVar5->prev = prVar4;
        (psVar7->next_in_list).next = &psVar7->next_in_list;
        (psVar7->next_in_list).prev = &psVar7->next_in_list;
        psVar2 = &cache->orders[psVar7->order].stats.total;
        *psVar2 = *psVar2 - psVar7->size;
        order = slab->order + '\x01';
        slab->order = order;
        sVar9 = slab_order_size(cache,order);
        slab->size = sVar9;
        psVar7 = slab_buddy(cache,slab);
        bVar10 = slab->order;
      } while (((psVar7 != (slab *)0x0) && (psVar7->order == bVar10)) && (psVar7->in_use == '\0'));
      psVar2 = &cache->orders[bVar10].stats.total;
      *psVar2 = *psVar2 + slab->size;
    }
  }
  uVar6 = slab->size;
  memset(slab + 1,0x50,uVar6 - 0x30);
  if (bVar10 == cache->order_max) {
    prVar4 = cache->orders[bVar10].slabs.next;
    if ((prVar4 != &cache->orders[bVar10].slabs) || (prVar4 != cache->orders[bVar10].slabs.prev)) {
      arena = cache->arena;
      if (uVar6 != arena->slab_size) {
        __assert_fail("slab->size == cache->arena->slab_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                      ,0x170,"void slab_put_with_order(struct slab_cache *, struct slab *)");
      }
      prVar4 = (slab->next_in_cache).prev;
      prVar5 = (slab->next_in_cache).next;
      prVar4->next = prVar5;
      prVar5->prev = prVar4;
      (slab->next_in_cache).next = &slab->next_in_cache;
      (slab->next_in_cache).prev = &slab->next_in_cache;
      psVar2 = &(cache->allocated).stats.total;
      *psVar2 = *psVar2 - uVar6;
      psVar2 = &cache->orders[bVar10].stats.total;
      *psVar2 = *psVar2 - uVar6;
      slab_unmap(arena,slab);
      return;
    }
  }
  (slab->next_in_list).prev = &cache->orders[bVar10].slabs;
  (slab->next_in_list).next = cache->orders[bVar10].slabs.next;
  cache->orders[bVar10].slabs.next = &slab->next_in_list;
  ((slab->next_in_list).next)->prev = &slab->next_in_list;
  return;
}

Assistant:

void
slab_put_with_order(struct slab_cache *cache, struct slab *slab)
{
	slab_assert(cache, slab);
	assert(slab->order <= cache->order_max);
	/* An "ordered" slab is returned to the cache. */
	slab_set_free(cache, slab);
	struct slab *buddy = slab_buddy(cache, slab);
	/*
	 * The buddy slab could also have been split into a pair
	 * of smaller slabs, the first of which happens to be
	 * free. To not merge with a slab which is in fact
	 * partially occupied, first check that slab orders match.
	 *
	 * A slab is not accounted in "used" or "total" counters
	 * if it was split into slabs of a lower order.
	 * cache->orders statistics only contains sizes of either
	 * slabs returned by slab_get, or present in the free
	 * list. This ensures that sums of cache->orders[i].stats
	 * match the totals in cache->allocated.stats.
	 */
	if (buddy && buddy->order == slab->order && slab_is_free(buddy)) {
		cache->orders[slab->order].stats.total -= slab->size;
		do {
			slab = slab_merge(cache, slab, buddy);
			buddy = slab_buddy(cache, slab);
		} while (buddy && buddy->order == slab->order &&
			 slab_is_free(buddy));
		cache->orders[slab->order].stats.total += slab->size;
	}
	slab_poison(slab);
	if (slab->order == cache->order_max &&
	    !rlist_empty(&cache->orders[slab->order].slabs)) {
		/*
		 * Largest slab should be returned to arena, but we do so
		 * only if the slab cache has at least one slab of that size
		 * in order to avoid oscillations.
		 */
		assert(slab->size == cache->arena->slab_size);
		slab_list_del(&cache->allocated, slab, next_in_cache);
		cache->orders[slab->order].stats.total -= slab->size;
		slab_unmap(cache->arena, slab);
	} else {
		/* Put the slab to the cache */
		rlist_add_entry(&cache->orders[slab->order].slabs, slab,
				next_in_list);
	}
}